

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

void mon_animal_list(boolean construct)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  short animal_temp [344];
  undefined2 local_2c8 [348];
  
  if (construct == '\0') {
    if (animal_list != (short *)0x0) {
      free(animal_list);
      animal_list = (short *)0x0;
    }
    animal_list_count = 0;
  }
  else {
    lVar1 = 0x305960;
    lVar2 = 0;
    iVar3 = 0;
    do {
      if ((*(byte *)(lVar1 + 2) & 4) != 0) {
        lVar4 = (long)iVar3;
        iVar3 = iVar3 + 1;
        local_2c8[lVar4] = (short)lVar2;
      }
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x40;
    } while (lVar2 != 0x158);
    animal_list = (short *)malloc((long)iVar3 * 2);
    memcpy(animal_list,local_2c8,(long)iVar3 * 2);
    animal_list_count = iVar3;
  }
  return;
}

Assistant:

void mon_animal_list(boolean construct)
{
	if (construct) {
	    short animal_temp[SPECIAL_PM];
	    int i, n;

	 /* if (animal_list) impossible("animal_list already exists"); */

	    for (n = 0, i = LOW_PM; i < SPECIAL_PM; i++)
		if (is_animal(&mons[i])) animal_temp[n++] = i;
	 /* if (n == 0) animal_temp[n++] = NON_PM; */

	    animal_list = malloc(n * sizeof *animal_list);
	    memcpy(animal_list,
			  animal_temp,
			  n * sizeof *animal_list);
	    animal_list_count = n;
	} else {	/* release */
	    if (animal_list) free(animal_list), animal_list = 0;
	    animal_list_count = 0;
	}
}